

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

Vector __thiscall stateObservation::kine::regulateOrientationVector(kine *this,Vector3 *v)

{
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar1;
  RealScalar RVar2;
  __type _Var3;
  double dVar4;
  Vector VVar5;
  double local_98;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_90;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_70;
  int local_2c;
  double dStack_28;
  uint k;
  double n;
  double n2;
  Vector3 *v_local;
  
  n2 = (double)v;
  v_local = (Vector3 *)this;
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::squaredNorm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)v);
  n = RVar2;
  _Var3 = std::pow<double,int>(4.71238898038469,2);
  if (RVar2 <= _Var3) {
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)n2);
    IVar1 = extraout_RDX_00;
  }
  else {
    dStack_28 = sqrt(n);
    dVar4 = ceil((dStack_28 + -3.141592653589793) / 6.283185307179586);
    local_2c = (int)(long)dVar4;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (&local_90,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)n2,&stack0xffffffffffffffd8)
    ;
    local_98 = -(double)(uint)(local_2c * 2) * 3.141592653589793 + dStack_28;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator*(&local_70,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                 *)&local_90,&local_98);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_70);
    IVar1 = extraout_RDX;
  }
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar5.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline Vector regulateOrientationVector(const Vector3 & v)
{
  double n2 = v.squaredNorm();
  if(n2 > std::pow(3. / 2. * M_PI, 2))
  {
    double n = sqrt(n2);
    unsigned k = unsigned(ceil((n - M_PI) / (2 * M_PI)));
    return (v / n) * (n - k * 2 * M_PI);
  }
  else
  {
    return v;
  }
}